

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-misc.c
# Opt level: O1

void greatest_prng_init_first_pass(int id)

{
  greatest_info.prng[id].random_order = '\x01';
  greatest_info.prng[id].count_run = 0;
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(test_example);
    RUN_TEST(calling_fread);
    RUN_TEST(calling_calloc_0_0);
    RUN_TEST(calling_malloc_0);
    RUN_TEST(calling_enum_lookup);

    GREATEST_MAIN_END(); /* display results */
}